

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_hdwallet.cpp
# Opt level: O0

CreateExtkeyResponseStruct *
cfd::js::api::HDWalletStructApi::CreateExtPubkey
          (CreateExtkeyResponseStruct *__return_storage_ptr__,CreateExtPubkeyRequestStruct *request)

{
  CreateExtPubkeyRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  CreateExtPubkeyRequestStruct *pCStack_18;
  anon_class_1_0_00000001 call_func;
  CreateExtPubkeyRequestStruct *request_local;
  CreateExtkeyResponseStruct *result;
  
  local_1a = 0;
  pCStack_18 = request;
  CreateExtkeyResponseStruct::CreateExtkeyResponseStruct(__return_storage_ptr__);
  this = pCStack_18;
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtPubkeyRequestStruct_const&)>
  ::
  function<cfd::js::api::HDWalletStructApi::CreateExtPubkey(cfd::js::api::CreateExtPubkeyRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::CreateExtkeyResponseStruct(cfd::js::api::CreateExtPubkeyRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"CreateExtPubkey",&local_129);
  ExecuteStructApi<cfd::js::api::CreateExtPubkeyRequestStruct,cfd::js::api::CreateExtkeyResponseStruct>
            ((CreateExtkeyResponseStruct *)(local_108 + 0x20),(api *)this,
             (CreateExtPubkeyRequestStruct *)local_108,&local_128,in_R8);
  CreateExtkeyResponseStruct::operator=
            (__return_storage_ptr__,(CreateExtkeyResponseStruct *)(local_108 + 0x20));
  CreateExtkeyResponseStruct::~CreateExtkeyResponseStruct
            ((CreateExtkeyResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&)>
  ::~function((function<cfd::js::api::CreateExtkeyResponseStruct_(const_cfd::js::api::CreateExtPubkeyRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

CreateExtkeyResponseStruct HDWalletStructApi::CreateExtPubkey(
    const CreateExtPubkeyRequestStruct& request) {
  auto call_func = [](const CreateExtPubkeyRequestStruct& request)
      -> CreateExtkeyResponseStruct {
    CreateExtkeyResponseStruct response;
    const NetType net_type = AddressStructApi::ConvertNetType(request.network);

    HDWalletApi api;
    std::string extkey = api.CreateExtPubkey(request.extkey, net_type);

    response.extkey = extkey;
    return response;
  };

  CreateExtkeyResponseStruct result;
  result = ExecuteStructApi<
      CreateExtPubkeyRequestStruct, CreateExtkeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}